

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_compress1X_usingCTable_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable,int bmi2)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  BYTE *ip;
  BIT_CStream_t local_48;
  
  if (bmi2 != 0) {
    sVar2 = HUF_compress1X_usingCTable_internal_bmi2(dst,dstSize,src,srcSize,CTable);
    return sVar2;
  }
  if (7 < dstSize) {
    local_48.bitContainer = 0;
    local_48.bitPos = 0;
    local_48.endPtr = (char *)((long)dst + (dstSize - 8));
    if (dstSize != 8) {
      uVar3 = srcSize & 0xfffffffffffffffc;
      local_48.startPtr = (char *)dst;
      local_48.ptr = (char *)dst;
      switch((uint)srcSize & 3) {
      case 0:
        while (uVar3 != 0) {
          bVar1 = *(byte *)((long)src + (uVar3 - 1));
          BIT_addBitsFast(&local_48,(ulong)CTable[bVar1].val,(uint)CTable[bVar1].nbBits);
          bVar1 = *(byte *)((long)src + (uVar3 - 2));
          BIT_addBitsFast(&local_48,(ulong)CTable[bVar1].val,(uint)CTable[bVar1].nbBits);
          bVar1 = *(byte *)((long)src + (uVar3 - 3));
          BIT_addBitsFast(&local_48,(ulong)CTable[bVar1].val,(uint)CTable[bVar1].nbBits);
          uVar3 = uVar3 - 4;
switchD_0010c546_caseD_1:
          BIT_addBitsFast(&local_48,(ulong)CTable[*(byte *)((long)src + uVar3)].val,
                          (uint)CTable[*(byte *)((long)src + uVar3)].nbBits);
          BIT_flushBits(&local_48);
        }
        sVar2 = BIT_closeCStream(&local_48);
        return sVar2;
      case 1:
        goto switchD_0010c546_caseD_1;
      case 3:
        bVar1 = *(byte *)((long)src + uVar3 + 2);
        BIT_addBitsFast(&local_48,(ulong)CTable[bVar1].val,(uint)CTable[bVar1].nbBits);
      }
      bVar1 = *(byte *)((long)src + uVar3 + 1);
      BIT_addBitsFast(&local_48,(ulong)CTable[bVar1].val,(uint)CTable[bVar1].nbBits);
      goto switchD_0010c546_caseD_1;
    }
  }
  return 0;
}

Assistant:

static size_t
HUF_compress1X_usingCTable_internal(void* dst, size_t dstSize,
                              const void* src, size_t srcSize,
                              const HUF_CElt* CTable, const int bmi2)
{
    if (bmi2) {
        return HUF_compress1X_usingCTable_internal_bmi2(dst, dstSize, src, srcSize, CTable);
    }
    return HUF_compress1X_usingCTable_internal_default(dst, dstSize, src, srcSize, CTable);
}